

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::updateLayoutDirection(QMenuPrivate *this)

{
  QWidget *this_00;
  Data *pDVar1;
  bool bVar2;
  LayoutDirection direction;
  QWidget *this_01;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar2 = QWidget::testAttribute_helper(this_00,WA_SetLayoutDirection);
  if (bVar2) {
    return;
  }
  pDVar1 = (this->causedPopup).widget.wp.d;
  if ((((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
      (this_01 = (QWidget *)(this->causedPopup).widget.wp.value, this_01 == (QWidget *)0x0)) &&
     (this_01 = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10), this_01 == (QWidget *)0x0)) {
    direction = QGuiApplication::layoutDirection();
  }
  else {
    direction = QWidget::layoutDirection(this_01);
  }
  QWidgetPrivate::setLayoutDirection_helper(&this->super_QWidgetPrivate,direction);
  return;
}

Assistant:

void QMenuPrivate::updateLayoutDirection()
{
    Q_Q(QMenu);
    //we need to mimic the cause of the popup's layout direction
    //to allow setting it on a mainwindow for example
    //we call setLayoutDirection_helper to not overwrite a user-defined value
    if (!q->testAttribute(Qt::WA_SetLayoutDirection)) {
        if (QWidget *w = causedPopup.widget)
            setLayoutDirection_helper(w->layoutDirection());
        else if (QWidget *w = q->parentWidget())
            setLayoutDirection_helper(w->layoutDirection());
        else
            setLayoutDirection_helper(QGuiApplication::layoutDirection());
    }
}